

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedBlackTree.cpp
# Opt level: O1

Node * __thiscall RedBlackTree::deleteBST(RedBlackTree *this,Node **root,int data)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  
  while( true ) {
    while( true ) {
      while( true ) {
        pNVar1 = *root;
        if (pNVar1 == (Node *)0x0) {
          return (Node *)0x0;
        }
        if (pNVar1->value <= data) break;
        root = &pNVar1->left;
      }
      if (data <= pNVar1->value) break;
      root = &pNVar1->right;
    }
    if (pNVar1->left == (Node *)0x0) break;
    if (pNVar1->right == (Node *)0x0) {
      return pNVar1;
    }
    root = &pNVar1->right;
    pNVar2 = pNVar1->right;
    do {
      pNVar3 = pNVar2;
      pNVar2 = pNVar3->left;
    } while (pNVar3->left != (Node *)0x0);
    pNVar1->value = pNVar3->value;
    data = pNVar3->value;
  }
  return pNVar1;
}

Assistant:

RedBlackTree::Node *RedBlackTree::deleteBST(Node *&root, int data) {
    if (root == nullptr) {
        return root;
    }

    if (data < root->value) {
        return deleteBST(root->left, data);
    }

    if (data > root->value) {
        return deleteBST(root->right, data);
    }

    if (root->left == nullptr || root->right == nullptr) {
        return root;
    }

    Node *temp = findMin(root->right);
    root->value = temp->value;
    return deleteBST(root->right, temp->value);
}